

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O3

void __thiscall DActiveButton::Serialize(DActiveButton *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  FSwitchDef **def;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = Serialize<side_t>(arc,"side",&this->m_Side,(side_t **)0x0);
  def = (FSwitchDef **)0x0;
  pFVar1 = ::Serialize(pFVar1,"part",&this->m_Part,(int8_t *)0x0);
  Serialize<FSwitchDef>(pFVar1,"switchdef",&this->m_SwitchDef,def);
  pFVar1 = ::Serialize(pFVar1,"frame",&this->m_Frame,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"timer",&this->m_Timer,(uint32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"fippable",&this->bFlippable,(bool *)0x0);
  pFVar1 = FSerializer::Array<double>(pFVar1,"pos",&(this->m_Pos).X,(double *)0x0,2,true);
  ::Serialize(pFVar1,"returning",&this->bReturning,(bool *)0x0);
  return;
}

Assistant:

void DActiveButton::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("side", m_Side)
		("part", m_Part)
		("switchdef", m_SwitchDef)
		("frame", m_Frame)
		("timer", m_Timer)
		("fippable", bFlippable)
		("pos", m_Pos)
		("returning", bReturning);
}